

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampTexParameterIErrors.cpp
# Opt level: O1

void __thiscall
glcts::TextureBorderClampTexParameterIErrorsTest::VerifyGLTexParameterIiv
          (TextureBorderClampTexParameterIErrorsTest *this,GLenum target,GLenum pname,GLint params,
          GLenum expected_error)

{
  int iVar1;
  GLenum GVar2;
  undefined4 extraout_var;
  char *pcVar3;
  size_t sVar4;
  GLint local_1d4;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  
  local_1d4 = params;
  iVar1 = (*((this->super_TextureBorderClampBase).super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x1340))(target,pname,&local_1d4);
  GVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (GVar2 != expected_error) {
    this->m_test_passed = '\0';
    local_1b0 = (undefined1  [8])
                ((this->super_TextureBorderClampBase).super_TestCaseBase.super_TestCase.
                 super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"glTexParameterIivEXT() failed:[",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"target:",7);
    pcVar3 = TextureBorderClampBase::getTexTargetString(&this->super_TextureBorderClampBase,target);
    iVar1 = (int)(ostringstream *)&local_1a8;
    if (pcVar3 == (char *)0x0) {
      std::ios::clear(iVar1 + (int)local_1a8[-3]);
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar3,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", pname:",8);
    pcVar3 = TextureBorderClampBase::getPNameString(&this->super_TextureBorderClampBase,pname);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear(iVar1 + (int)local_1a8[-3]);
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar3,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"] reported error code:[",0x17);
    local_1c0.m_getName = glu::getErrorName;
    local_1c0.m_value = GVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"] expected error code:[",0x17);
    local_1d0.m_getName = glu::getErrorName;
    local_1d0.m_value = expected_error;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"]\n",2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

void TextureBorderClampTexParameterIErrorsTest::VerifyGLTexParameterIiv(glw::GLenum target, glw::GLenum pname,
																		glw::GLint params, glw::GLenum expected_error)
{
	glw::GLenum			  error_code = GL_NO_ERROR;
	const glw::Functions& gl		 = m_context.getRenderContext().getFunctions();

	gl.texParameterIiv(target, pname, &params);

	error_code = gl.getError();
	if (expected_error != error_code)
	{
		m_test_passed = false;

		m_testCtx.getLog() << tcu::TestLog::Message << "glTexParameterIivEXT() failed:["
						   << "target:" << getTexTargetString(target) << ", pname:" << getPNameString(pname)
						   << "] reported error code:[" << glu::getErrorStr(error_code) << "] expected error code:["
						   << glu::getErrorStr(expected_error) << "]\n"
						   << tcu::TestLog::EndMessage;
	}
}